

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_compressionParameters *cParams,
                 ZSTD_useRowMatchFinderMode_e useRowMatchFinder,ZSTD_compResetPolicy_e crp,
                 ZSTD_indexResetPolicy_e forceResetIndex,ZSTD_resetTarget_e forWho)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ZSTD_strategy ZVar6;
  void *pvVar7;
  U32 *pUVar8;
  uint *puVar9;
  ZSTD_match_t *pZVar10;
  ZSTD_optimal_t *pZVar11;
  U16 *__s;
  byte bVar12;
  int iVar13;
  U32 UVar14;
  int iVar15;
  size_t sVar16;
  void *__s_00;
  uint uVar17;
  
  if (((forWho == ZSTD_resetTarget_CDict) && (ms->dedicatedDictSearch != 0)) ||
     ((cParams->strategy != ZSTD_fast &&
      (useRowMatchFinder != ZSTD_urm_enableRowMatchFinder || 2 < cParams->strategy - ZSTD_greedy))))
  {
    sVar16 = 4L << ((byte)cParams->chainLog & 0x3f);
  }
  else {
    sVar16 = 0;
  }
  uVar1 = cParams->hashLog;
  uVar17 = 0;
  if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->minMatch == 3)) {
    uVar17 = 0x11;
    if (cParams->windowLog < 0x11) {
      uVar17 = cParams->windowLog;
    }
  }
  if (forceResetIndex == ZSTDirp_reset) {
    *(undefined8 *)&(ms->window).nbOverflowCorrections = 0;
    iVar15 = 0x5da239;
    (ms->window).base = "";
    (ms->window).dictBase = "";
    iVar13 = 0x5da23a;
    (ms->window).nextSrc = (BYTE *)"PK\x06\x06";
    pvVar7 = ws->objectEnd;
    ws->tableValidEnd = pvVar7;
  }
  else {
    iVar13 = (int)(ms->window).nextSrc;
    iVar15 = (int)(ms->window).base;
    pvVar7 = ws->objectEnd;
  }
  ms->hashLog3 = uVar17;
  UVar14 = iVar13 - iVar15;
  (ms->window).lowLimit = UVar14;
  (ms->window).dictLimit = UVar14;
  ms->nextToUpdate = UVar14;
  ms->loadedDictEnd = 0;
  (ms->opt).litLengthSum = 0;
  ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  ws->tableEnd = pvVar7;
  bVar12 = (byte)uVar1;
  pUVar8 = (U32 *)ZSTD_cwksp_reserve_table(ws,4L << (bVar12 & 0x3f));
  ms->hashTable = pUVar8;
  pUVar8 = (U32 *)ZSTD_cwksp_reserve_table(ws,sVar16);
  ms->chainTable = pUVar8;
  sVar16 = 4L << ((byte)uVar17 & 0x3f);
  if (uVar17 == 0) {
    sVar16 = 0;
  }
  pUVar8 = (U32 *)ZSTD_cwksp_reserve_table(ws,sVar16);
  ms->hashTable3 = pUVar8;
  if (ws->allocFailed == '\0') {
    if (crp != ZSTDcrp_leaveDirty) {
      pvVar7 = ws->tableEnd;
      __s_00 = ws->tableValidEnd;
      if (__s_00 < pvVar7) {
        memset(__s_00,0,(long)pvVar7 - (long)__s_00);
        pvVar7 = ws->tableEnd;
        __s_00 = ws->tableValidEnd;
      }
      if (__s_00 < pvVar7) {
        ws->tableValidEnd = pvVar7;
      }
    }
    ZVar6 = cParams->strategy;
    if (ZSTD_btlazy2 < ZVar6 && forWho == ZSTD_resetTarget_CCtx) {
      puVar9 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x400);
      (ms->opt).litFreq = puVar9;
      puVar9 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x90);
      (ms->opt).litLengthFreq = puVar9;
      puVar9 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0xd4);
      (ms->opt).matchLengthFreq = puVar9;
      puVar9 = (uint *)ZSTD_cwksp_reserve_aligned(ws,0x80);
      (ms->opt).offCodeFreq = puVar9;
      pZVar10 = (ZSTD_match_t *)ZSTD_cwksp_reserve_aligned(ws,0x8008);
      (ms->opt).matchTable = pZVar10;
      pZVar11 = (ZSTD_optimal_t *)ZSTD_cwksp_reserve_aligned(ws,0x1c01c);
      (ms->opt).priceTable = pZVar11;
      ZVar6 = cParams->strategy;
    }
    if ((useRowMatchFinder == ZSTD_urm_enableRowMatchFinder) && (0xfffffffc < ZVar6 - ZSTD_btlazy2))
    {
      sVar16 = 2L << (bVar12 & 0x3f);
      __s = (U16 *)ZSTD_cwksp_reserve_aligned(ws,sVar16);
      ms->tagTable = __s;
      if (__s != (U16 *)0x0) {
        memset(__s,0,sVar16);
      }
      ms->rowHashLog = (cParams->hashLog - 5) + (uint)(cParams->searchLog < 5);
    }
    uVar2 = cParams->windowLog;
    uVar3 = cParams->chainLog;
    uVar4 = cParams->hashLog;
    uVar5 = cParams->searchLog;
    uVar1 = cParams->minMatch;
    uVar17 = cParams->targetLength;
    ZVar6 = cParams->strategy;
    (ms->cParams).searchLog = cParams->searchLog;
    (ms->cParams).minMatch = uVar1;
    (ms->cParams).targetLength = uVar17;
    (ms->cParams).strategy = ZVar6;
    (ms->cParams).windowLog = uVar2;
    (ms->cParams).chainLog = uVar3;
    (ms->cParams).hashLog = uVar4;
    (ms->cParams).searchLog = uVar5;
    sVar16 = (ulong)(ws->allocFailed == '\0') * 0x40 - 0x40;
  }
  else {
    sVar16 = 0xffffffffffffffc0;
  }
  return sVar16;
}

Assistant:

static size_t
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      ZSTD_cwksp* ws,
                const ZSTD_compressionParameters* cParams,
                const ZSTD_useRowMatchFinderMode_e useRowMatchFinder,
                const ZSTD_compResetPolicy_e crp,
                const ZSTD_indexResetPolicy_e forceResetIndex,
                const ZSTD_resetTarget_e forWho)
{
    /* disable chain table allocation for fast or row-based strategies */
    size_t const chainSize = ZSTD_allocateChainTable(cParams->strategy, useRowMatchFinder,
                                                     ms->dedicatedDictSearch && (forWho == ZSTD_resetTarget_CDict))
                                ? ((size_t)1 << cParams->chainLog)
                                : 0;
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = ((forWho == ZSTD_resetTarget_CCtx) && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;

    DEBUGLOG(4, "reset indices : %u", forceResetIndex == ZSTDirp_reset);
    assert(useRowMatchFinder != ZSTD_urm_auto);
    if (forceResetIndex == ZSTDirp_reset) {
        ZSTD_window_init(&ms->window);
        ZSTD_cwksp_mark_tables_dirty(ws);
    }

    ms->hashLog3 = hashLog3;

    ZSTD_invalidateMatchState(ms);

    assert(!ZSTD_cwksp_reserve_failed(ws)); /* check that allocation hasn't already failed */

    ZSTD_cwksp_clear_tables(ws);

    DEBUGLOG(5, "reserving table space");
    /* table Space */
    ms->hashTable = (U32*)ZSTD_cwksp_reserve_table(ws, hSize * sizeof(U32));
    ms->chainTable = (U32*)ZSTD_cwksp_reserve_table(ws, chainSize * sizeof(U32));
    ms->hashTable3 = (U32*)ZSTD_cwksp_reserve_table(ws, h3Size * sizeof(U32));
    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_leaveDirty);
    if (crp!=ZSTDcrp_leaveDirty) {
        /* reset tables only */
        ZSTD_cwksp_clean_tables(ws);
    }

    /* opt parser space */
    if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->strategy >= ZSTD_btopt)) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (1<<Litbits) * sizeof(unsigned));
        ms->opt.litLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxLL+1) * sizeof(unsigned));
        ms->opt.matchLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxML+1) * sizeof(unsigned));
        ms->opt.offCodeFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxOff+1) * sizeof(unsigned));
        ms->opt.matchTable = (ZSTD_match_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_match_t));
        ms->opt.priceTable = (ZSTD_optimal_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_optimal_t));
    }

    if (ZSTD_rowMatchFinderUsed(cParams->strategy, useRowMatchFinder)) {
        {   /* Row match finder needs an additional table of hashes ("tags") */
            size_t const tagTableSize = hSize*sizeof(U16);
            ms->tagTable = (U16*)ZSTD_cwksp_reserve_aligned(ws, tagTableSize);
            if (ms->tagTable) ZSTD_memset(ms->tagTable, 0, tagTableSize);
        }
        {   /* Switch to 32-entry rows if searchLog is 5 (or more) */
            U32 const rowLog = cParams->searchLog < 5 ? 4 : 5;
            assert(cParams->hashLog > rowLog);
            ms->rowHashLog = cParams->hashLog - rowLog;
        }
    }

    ms->cParams = *cParams;

    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");
    return 0;
}